

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void __thiscall
FBitmap::CopyPixelDataRGB
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,int ct,FCopyInfo *inf,int r,int g,int b)

{
  BYTE BVar1;
  BYTE BVar2;
  BYTE BVar3;
  int iVar4;
  FCopyInfo *pFVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  BYTE *pBVar10;
  int srcheight_local;
  int srcwidth_local;
  int originy_local;
  int originx_local;
  BYTE *local_60;
  FBitmap *local_58;
  long local_50;
  CopyFunc_conflict *local_48;
  ulong local_40;
  BYTE *patch_local;
  
  srcheight_local = srcheight;
  srcwidth_local = srcwidth;
  originy_local = originy;
  originx_local = originx;
  local_58 = this;
  patch_local = patch;
  bVar7 = ClipCopyPixelRect(&this->ClipRect,&originx_local,&originy_local,&patch_local,
                            &srcwidth_local,&srcheight_local,&step_x,&step_y,rotate);
  iVar6 = srcwidth_local;
  pFVar5 = inf;
  iVar4 = step_x;
  if (bVar7) {
    uVar8 = 0;
    if (inf == (FCopyInfo *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (long)(int)inf->op;
    }
    local_60 = local_58->data +
               (long)originy_local * (long)local_58->Pitch + (long)originx_local * 4;
    local_48 = copyfuncs[lVar9] + ct;
    local_50 = (long)step_y;
    local_40 = (ulong)(uint)srcheight_local;
    if (srcheight_local < 1) {
      local_40 = uVar8;
    }
    BVar3 = (BYTE)b;
    BVar2 = (BYTE)g;
    BVar1 = (BYTE)r;
    pBVar10 = patch_local;
    for (; local_40 != uVar8; uVar8 = uVar8 + 1) {
      (**local_48)(local_60 + (long)local_58->Pitch * uVar8,pBVar10,iVar6,iVar4,pFVar5,BVar1,BVar2,
                   BVar3);
      pBVar10 = pBVar10 + local_50;
    }
  }
  return;
}

Assistant:

void FBitmap::CopyPixelDataRGB(int originx, int originy, const BYTE *patch, int srcwidth, 
							   int srcheight, int step_x, int step_y, int rotate, int ct, FCopyInfo *inf,
							   int r, int g, int b)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4 * originx + Pitch * originy;
		int op = inf==NULL? OP_COPY : inf->op;
		for (int y=0;y<srcheight;y++)
		{
			copyfuncs[op][ct](&buffer[y*Pitch], &patch[y*step_y], srcwidth, step_x, inf, r, g, b);
		}
	}
}